

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ContinuousAssignSymbol::serializeTo
          (ContinuousAssignSymbol *this,ASTSerializer *serializer)

{
  bool bVar1;
  Expression *__n;
  TimingControl *__n_00;
  ASTSerializer *in_RSI;
  string_view sVar2;
  ContinuousAssignSymbol *in_stack_00000008;
  type *ds1;
  type *ds0;
  TimingControl *delayCtrl;
  ContinuousAssignSymbol *in_stack_ffffffffffffff40;
  ASTSerializer *in_stack_ffffffffffffff48;
  ASTSerializer *in_stack_ffffffffffffff50;
  undefined8 local_98;
  undefined4 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined4 local_68;
  undefined8 local_60;
  int __fd;
  ContinuousAssignSymbol *in_stack_ffffffffffffffc8;
  undefined8 local_30;
  undefined4 local_20;
  undefined8 local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff50,
             (char *)in_stack_ffffffffffffff48);
  __n = getAssignment(in_stack_ffffffffffffffc8);
  __fd = (int)in_stack_ffffffffffffffc8;
  ASTSerializer::write(in_RSI,local_20,local_18,(size_t)__n);
  __n_00 = getDelay(in_stack_00000008);
  if (__n_00 != (TimingControl *)0x0) {
    in_stack_ffffffffffffff50 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
               (char *)in_stack_ffffffffffffff48);
    ASTSerializer::write(in_stack_ffffffffffffff50,__fd,local_30,(size_t)__n_00);
  }
  getDriveStrength(in_stack_ffffffffffffff40);
  std::get<0ul,std::optional<slang::ast::DriveStrength>,std::optional<slang::ast::DriveStrength>>
            ((pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
              *)0xff90e3);
  std::get<1ul,std::optional<slang::ast::DriveStrength>,std::optional<slang::ast::DriveStrength>>
            ((pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
              *)0xff90f5);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::DriveStrength> *)0xff9104);
  if (bVar1) {
    in_stack_ffffffffffffff48 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff50,
               (char *)in_RSI);
    std::optional<slang::ast::DriveStrength>::operator*
              ((optional<slang::ast::DriveStrength> *)0xff9132);
    sVar2 = ast::toString(Supply);
    local_78 = sVar2._M_len;
    ASTSerializer::write(in_stack_ffffffffffffff48,local_68,local_60,local_78);
  }
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::DriveStrength> *)0xff916b);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff50,
               (char *)in_stack_ffffffffffffff48);
    std::optional<slang::ast::DriveStrength>::operator*
              ((optional<slang::ast::DriveStrength> *)0xff9199);
    sVar2 = ast::toString(Supply);
    local_98 = sVar2._M_len;
    ASTSerializer::write(in_RSI,local_88,local_80,local_98);
  }
  return;
}

Assistant:

void ContinuousAssignSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("assignment", getAssignment());

    if (auto delayCtrl = getDelay())
        serializer.write("delay", *delayCtrl);

    auto [ds0, ds1] = getDriveStrength();
    if (ds0)
        serializer.write("driveStrength0", toString(*ds0));
    if (ds1)
        serializer.write("driveStrength1", toString(*ds1));
}